

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_inst.c
# Opt level: O2

void block_op(vm *v,instruction *inst)

{
  int32 *piVar1;
  func_type bt_00;
  func_type bt;
  
  piVar1 = (int32 *)inst->arg;
  get_block_type(&bt,v,*piVar1);
  bt_00.param_types = bt.param_types;
  bt_00.param_count = bt.param_count;
  bt_00._4_4_ = bt._4_4_;
  bt_00.return_count = bt.return_count;
  bt_00._20_4_ = bt._20_4_;
  bt_00.return_types = bt.return_types;
  enterBlock(v,'\x02',bt_00,(vec *)(piVar1 + 2));
  return;
}

Assistant:

void block_op(vm *v, instruction *inst) {
    blockArgs *ba = (blockArgs *) inst->arg;
    func_type bt = get_block_type(v, ba->blockType);
    enterBlock(v, Block, bt, &ba->instructions);
}